

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
ft::vector<char,_ft::allocator<char>_>::vector
          (vector<char,_ft::allocator<char>_> *this,size_type n,value_type *val,
          allocator_type *alloc)

{
  ulong uVar1;
  pointer pcVar2;
  size_type sVar3;
  ulong local_48;
  size_type i;
  undefined1 local_29 [9];
  allocator_type *alloc_local;
  value_type *val_local;
  size_type n_local;
  vector<char,_ft::allocator<char>_> *this_local;
  
  this->m_data = (pointer)0x0;
  this->m_size = n;
  this->m_capacity = n;
  local_29._1_8_ = alloc;
  alloc_local = (allocator_type *)val;
  val_local = (value_type *)n;
  n_local = (size_type)this;
  allocator<char>::allocator((allocator<char> *)&this->field_0x18,alloc);
  get_allocator((vector<char,_ft::allocator<char>_> *)local_29);
  pcVar2 = allocator<char>::allocate((allocator<char> *)local_29,(size_type)val_local);
  this->m_data = pcVar2;
  allocator<char>::~allocator((allocator<char> *)local_29);
  local_48 = 0;
  while( true ) {
    uVar1 = local_48;
    sVar3 = size(this);
    if (sVar3 <= uVar1) break;
    get_allocator((vector<char,_ft::allocator<char>_> *)&stack0xffffffffffffffb7);
    allocator<char>::construct
              ((allocator<char> *)&stack0xffffffffffffffb7,this->m_data + local_48,
               (const_reference)alloc_local);
    allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

explicit vector(size_type n, value_type const & val = value_type(),
				 allocator_type const & alloc = allocator_type()):
		m_data(NULL),
		m_size(n),
		m_capacity(n),
		m_alloc(alloc) {
		this->m_data = this->get_allocator().allocate(n);
		for (size_type i = 0; i < this->size(); ++i)
			this->get_allocator().construct(this->m_data + i, val);
	}